

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O3

xml_node<char> * __thiscall
rapidxml::xml_node<char>::first_node
          (xml_node<char> *this,char *name,size_t name_size,bool case_sensitive)

{
  char *pcVar1;
  byte *pbVar2;
  xml_node<char> *pxVar3;
  byte *pbVar4;
  char *end;
  byte *pbVar5;
  
  if (name == (char *)0x0) {
    pxVar3 = this->m_first_node;
  }
  else {
    if (name_size == 0) {
      pbVar2 = (byte *)0xffffffffffffffff;
      do {
        name_size = (size_t)(pbVar2 + 1);
        pcVar1 = name + 1 + (long)pbVar2;
        pbVar2 = (byte *)name_size;
      } while (*pcVar1 != '\0');
    }
    for (pxVar3 = this->m_first_node; pxVar3 != (xml_node<char> *)0x0;
        pxVar3 = pxVar3->m_next_sibling) {
      pbVar2 = (byte *)(pxVar3->super_xml_base<char>).m_name;
      pbVar4 = pbVar2;
      if (pbVar2 == (byte *)0x0) {
        pbVar4 = &xml_base<char>::nullstr()::zero;
      }
      if (pbVar2 != (byte *)0x0) {
        pbVar2 = (byte *)(pxVar3->super_xml_base<char>).m_name_size;
      }
      if (pbVar2 == (byte *)name_size) {
        pbVar2 = pbVar4 + name_size;
        if (case_sensitive) {
          pbVar5 = (byte *)name;
          if ((long)name_size < 1) {
            return pxVar3;
          }
          while (*pbVar4 == *pbVar5) {
            pbVar4 = pbVar4 + 1;
            pbVar5 = pbVar5 + 1;
            if (pbVar2 <= pbVar4) {
              return pxVar3;
            }
          }
        }
        else {
          pbVar5 = (byte *)name;
          if ((long)name_size < 1) {
            return pxVar3;
          }
          while (internal::lookup_tables<0>::lookup_upcase[*pbVar4] ==
                 internal::lookup_tables<0>::lookup_upcase[*pbVar5]) {
            pbVar4 = pbVar4 + 1;
            pbVar5 = pbVar5 + 1;
            if (pbVar2 <= pbVar4) {
              return pxVar3;
            }
          }
        }
      }
      if ((pxVar3->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) {
        __assert_fail("this->m_parent",
                      "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/arbiter/third/xml/rapidxml.hpp"
                      ,0x406,
                      "xml_node<Ch> *rapidxml::xml_node<>::next_sibling(const Ch *, std::size_t, bool) const [Ch = char]"
                     );
      }
    }
    pxVar3 = (xml_node<char> *)0x0;
  }
  return pxVar3;
}

Assistant:

xml_node<Ch> *first_node(const Ch *name = 0, std::size_t name_size = 0, bool case_sensitive = true) const
        {
            if (name)
            {
                if (name_size == 0)
                    name_size = internal::measure(name);
                for (xml_node<Ch> *child = m_first_node; child; child = child->next_sibling())
                    if (internal::compare(child->name(), child->name_size(), name, name_size, case_sensitive))
                        return child;
                return 0;
            }
            else
                return m_first_node;
        }